

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPE.cc
# Opt level: O2

void __thiscall
onmt::BPE::recursive_split
          (BPE *this,Token *piece,vector<onmt::Token,_std::allocator<onmt::Token>_> *pieces_in_vocab
          ,bool first,bool last)

{
  bool bVar1;
  const_iterator cVar2;
  Token left_piece;
  string bpe_surface;
  string local_100;
  string local_e0;
  Token local_c0;
  Token local_78;
  
  std::__cxx11::string::string((string *)&bpe_surface,(string *)piece);
  if ((this->_prefix & first) == 1) {
    std::operator+(&left_piece.surface,&this->_begin_of_word,&bpe_surface);
    std::__cxx11::string::operator=((string *)&bpe_surface,(string *)&left_piece);
    std::__cxx11::string::~string((string *)&left_piece);
  }
  if ((this->_suffix & last) == 1) {
    std::operator+(&left_piece.surface,&bpe_surface,&this->_end_of_word);
    std::__cxx11::string::operator=((string *)&bpe_surface,(string *)&left_piece);
    std::__cxx11::string::~string((string *)&left_piece);
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->_codes_reverse)._M_h,&bpe_surface);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
              (pieces_in_vocab,piece);
    goto LAB_001e90e1;
  }
  std::__cxx11::string::substr
            ((ulong)&local_e0,
             (long)cVar2.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                   ._M_cur + 0x28);
  Token::Token(&left_piece,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  if (first) {
    left_piece.join_right = true;
    left_piece.join_left = piece->join_left;
    if (piece->join_left != true) goto LAB_001e8fac;
    left_piece.preserve = piece->preserve;
  }
  else {
    left_piece.join_left = false;
    left_piece.join_right = true;
LAB_001e8fac:
    left_piece.preserve = false;
  }
  bVar1 = in_vocabulary(this,&left_piece,first,false);
  if (bVar1) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
              (pieces_in_vocab,&left_piece);
  }
  else {
    Token::Token(&local_78,&left_piece);
    recursive_split(this,&local_78,pieces_in_vocab,first,false);
    Token::~Token(&local_78);
  }
  Token::~Token(&left_piece);
  std::__cxx11::string::substr
            ((ulong)&local_100,
             (long)cVar2.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                   ._M_cur + 0x48);
  Token::Token(&left_piece,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  if (last) {
    left_piece._40_2_ = (ushort)piece->join_right << 8;
    if (piece->join_right != true) goto LAB_001e9073;
    left_piece.preserve = piece->preserve;
  }
  else {
    left_piece.join_left = false;
    left_piece.join_right = true;
LAB_001e9073:
    left_piece.preserve = false;
  }
  bVar1 = in_vocabulary(this,&left_piece,false,last);
  if (bVar1) {
    std::vector<onmt::Token,_std::allocator<onmt::Token>_>::emplace_back<onmt::Token>
              (pieces_in_vocab,&left_piece);
  }
  else {
    Token::Token(&local_c0,&left_piece);
    recursive_split(this,&local_c0,pieces_in_vocab,false,last);
    Token::~Token(&local_c0);
  }
  Token::~Token(&left_piece);
LAB_001e90e1:
  std::__cxx11::string::~string((string *)&bpe_surface);
  return;
}

Assistant:

void BPE::recursive_split(Token piece,
                            std::vector<Token>& pieces_in_vocab,
                            const bool first,
                            const bool last) const
  {
    // Recursively split segment into smaller units (by reversing BPE merges)
    // until all units are either in - vocabulary, or cannot be split further.
    std::string bpe_surface = piece.surface;
    size_t left_offset = 0;
    size_t right_offset = 0;
    if (_prefix && first)
    {
      bpe_surface = _begin_of_word + bpe_surface;
      left_offset = _begin_of_word.size();
    }
    if (_suffix && last)
    {
      bpe_surface = bpe_surface + _end_of_word;
      right_offset = _end_of_word.size();
    }

    auto it = _codes_reverse.find(bpe_surface);
    if (it == _codes_reverse.end())
    {
      pieces_in_vocab.emplace_back(std::move(piece));
      return;
    }

    const auto& pair = it->second;

    {
      Token left_piece(pair.first.substr(left_offset));
      left_piece.join_left = first && piece.join_left;
      left_piece.join_right = true;
      left_piece.preserve = first && piece.join_left && piece.preserve;

      if (in_vocabulary(left_piece, first, false))
        pieces_in_vocab.emplace_back(std::move(left_piece));
      else
        recursive_split(std::move(left_piece), pieces_in_vocab, first, false);
    }

    {
      Token right_piece(pair.second.substr(0, pair.second.size() - right_offset));
      right_piece.join_left = false;
      right_piece.join_right = !last || piece.join_right;
      right_piece.preserve = last && piece.join_right && piece.preserve;

      if (in_vocabulary(right_piece, false, last))
        pieces_in_vocab.emplace_back(std::move(right_piece));
      else
        recursive_split(std::move(right_piece), pieces_in_vocab, false, last);
    }
  }